

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert-llama2c-to-ggml.cpp
# Opt level: O2

string * __thiscall
my_llama_file::read_string_abi_cxx11_
          (string *__return_storage_ptr__,my_llama_file *this,uint32_t len)

{
  ulong __n;
  vector<char,_std::allocator<char>_> chars;
  allocator_type local_39;
  _Vector_base<char,_std::allocator<char>_> local_38;
  
  __n = (ulong)len;
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)&local_38,__n,&local_39);
  read_raw(this,local_38._M_impl.super__Vector_impl_data._M_start,__n);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,local_38._M_impl.super__Vector_impl_data._M_start,
             local_38._M_impl.super__Vector_impl_data._M_start + __n);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string read_string(std::uint32_t len) {
        std::vector<char> chars(len);
        read_raw(chars.data(), len);
        return std::string(chars.data(), len);
    }